

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAtomic.h
# Opt level: O0

size_t deAtomicIncrementUSize(size_t *size)

{
  deUint64 dVar1;
  size_t *size_local;
  
  dVar1 = deAtomicIncrementUint64(size);
  return dVar1;
}

Assistant:

DE_INLINE size_t deAtomicIncrementUSize (volatile size_t* size)
{
#if (DE_PTR_SIZE == 8)
	return deAtomicIncrementUint64((volatile deUint64*)size);
#elif (DE_PTR_SIZE == 4)
	return deAtomicIncrementUint32((volatile deUint32*)size);
#else
#	error "Invalid DE_PTR_SIZE value"
#endif
}